

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void nng_stats_free(nni_stat *st)

{
  nni_stat *st_00;
  
  while( true ) {
    st_00 = (nni_stat *)nni_list_first(&st->s_children);
    if (st_00 == (nni_stat *)0x0) break;
    nni_list_remove(&st->s_children,st_00);
    nng_stats_free(st_00);
  }
  if ((st->s_info->field_0x18 & 2) != 0) {
    nni_strfree((st->s_val).sv_string);
  }
  nni_free(st,0x50);
  return;
}

Assistant:

void
nng_stats_free(nni_stat *st)
{
#ifdef NNG_ENABLE_STATS
	nni_stat *child;

	while ((child = nni_list_first(&st->s_children)) != NULL) {
		nni_list_remove(&st->s_children, child);
		nng_stats_free(child);
	}
	if (st->s_info->si_alloc) {
		nni_strfree(st->s_val.sv_string);
	}
	NNI_FREE_STRUCT(st);
#else
	NNI_ARG_UNUSED(st);
#endif
}